

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

int multi_getsock(Curl_easy *data,curl_socket_t *socks,int numsocks)

{
  CURLMstate CVar1;
  connectdata *conn;
  _func_int_connectdata_ptr_curl_socket_t_ptr_int *UNRECOVERED_JUMPTABLE;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  long lVar7;
  
  uVar3 = 0;
  uVar5 = 0;
  if (((data->state).pipe_broke == false) &&
     (conn = data->easy_conn, uVar5 = uVar3, conn != (connectdata *)0x0)) {
    CVar1 = data->mstate;
    if (CVar1 - CURLM_STATE_WAITRESOLVE < 0xe) {
      conn->data = data;
    }
    switch(CVar1) {
    case CURLM_STATE_WAITCONNECT:
      if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
         ((conn->bits).proxy_ssl_connected[0] == false)) {
        iVar4 = Curl_ssl_getsock(conn,socks,5);
        return iVar4;
      }
      lVar7 = 0;
      uVar5 = 0;
      iVar4 = 0;
      bVar2 = true;
      do {
        bVar6 = bVar2;
        if (conn->tempsock[lVar7] != -1) {
          socks[iVar4] = conn->tempsock[lVar7];
          uVar5 = uVar5 | 1 << ((byte)((char)iVar4 + 0x10) & 0x1f);
          iVar4 = iVar4 + 1;
        }
        lVar7 = 1;
        bVar2 = false;
      } while (bVar6);
      break;
    case CURLM_STATE_WAITPROXYCONNECT:
      *socks = conn->sock[0];
      iVar4 = 0x10000;
      if (conn->tunnel_state[0] == TUNNEL_CONNECT) {
        iVar4 = 1;
      }
      return iVar4;
    case CURLM_STATE_SENDPROTOCONNECT:
    case CURLM_STATE_PROTOCONNECT:
      iVar4 = Curl_protocol_getsock(conn,socks,5);
      return iVar4;
    case CURLM_STATE_DO:
    case CURLM_STATE_DOING:
      iVar4 = Curl_doing_getsock(conn,socks,5);
      return iVar4;
    case CURLM_STATE_DO_MORE:
      UNRECOVERED_JUMPTABLE = conn->handler->domore_getsock;
      if (UNRECOVERED_JUMPTABLE != (_func_int_connectdata_ptr_curl_socket_t_ptr_int *)0x0) {
        iVar4 = (*UNRECOVERED_JUMPTABLE)(conn,socks,5);
        return iVar4;
      }
      break;
    case CURLM_STATE_DO_DONE:
    case CURLM_STATE_WAITPERFORM:
    case CURLM_STATE_PERFORM:
      iVar4 = Curl_single_getsock(conn,socks,5);
      return iVar4;
    }
  }
  return uVar5;
}

Assistant:

static int multi_getsock(struct Curl_easy *data,
                         curl_socket_t *socks, /* points to numsocks number
                                                  of sockets */
                         int numsocks)
{
  /* If the pipe broke, or if there's no connection left for this easy handle,
     then we MUST bail out now with no bitmask set. The no connection case can
     happen when this is called from curl_multi_remove_handle() =>
     singlesocket() => multi_getsock().
  */
  if(data->state.pipe_broke || !data->easy_conn)
    return 0;

  if(data->mstate > CURLM_STATE_CONNECT &&
     data->mstate < CURLM_STATE_COMPLETED) {
    /* Set up ownership correctly */
    data->easy_conn->data = data;
  }

  switch(data->mstate) {
  default:
#if 0 /* switch back on these cases to get the compiler to check for all enums
         to be present */
  case CURLM_STATE_TOOFAST:  /* returns 0, so will not select. */
  case CURLM_STATE_COMPLETED:
  case CURLM_STATE_MSGSENT:
  case CURLM_STATE_INIT:
  case CURLM_STATE_CONNECT:
  case CURLM_STATE_WAITDO:
  case CURLM_STATE_DONE:
  case CURLM_STATE_LAST:
    /* this will get called with CURLM_STATE_COMPLETED when a handle is
       removed */
#endif
    return 0;

  case CURLM_STATE_WAITRESOLVE:
    return Curl_resolver_getsock(data->easy_conn, socks, numsocks);

  case CURLM_STATE_PROTOCONNECT:
  case CURLM_STATE_SENDPROTOCONNECT:
    return Curl_protocol_getsock(data->easy_conn, socks, numsocks);

  case CURLM_STATE_DO:
  case CURLM_STATE_DOING:
    return Curl_doing_getsock(data->easy_conn, socks, numsocks);

  case CURLM_STATE_WAITPROXYCONNECT:
    return waitproxyconnect_getsock(data->easy_conn, socks, numsocks);

  case CURLM_STATE_WAITCONNECT:
    return waitconnect_getsock(data->easy_conn, socks, numsocks);

  case CURLM_STATE_DO_MORE:
    return domore_getsock(data->easy_conn, socks, numsocks);

  case CURLM_STATE_DO_DONE: /* since is set after DO is completed, we switch
                               to waiting for the same as the *PERFORM
                               states */
  case CURLM_STATE_PERFORM:
  case CURLM_STATE_WAITPERFORM:
    return Curl_single_getsock(data->easy_conn, socks, numsocks);
  }

}